

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O3

void __thiscall
Opcode::AABBTreeCollider::_CollideTriBox(AABBTreeCollider *this,AABBQuantizedNoLeafNode *b)

{
  Point *v0;
  Point *v1;
  Point *v2;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  undefined8 uVar3;
  undefined4 uVar7;
  undefined8 uVar4;
  undefined8 uVar5;
  udword uVar8;
  AABBQuantizedNoLeafNode *b_00;
  MeshInterface *pMVar9;
  IndexedTriangle *pIVar10;
  udword q;
  BOOL BVar11;
  long lVar12;
  ulong uVar13;
  Point *pPVar14;
  udword *puVar15;
  udword uVar16;
  Container *this_00;
  ulong uVar17;
  Point *pPVar18;
  ulong uVar19;
  Point *pPVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  Point vmin;
  Point vmax;
  Point normal;
  Point local_1a4;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_114 [4];
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b0;
  float local_a8;
  float local_a4;
  undefined8 local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  do {
    fVar25 = (float)(int)(b->mAABB).mCenter[0] * (this->mCenterCoeff1).x;
    fStack_16c = (float)(int)(b->mAABB).mCenter[1] * (this->mCenterCoeff1).y;
    fStack_dc = (float)(int)(b->mAABB).mCenter[2] * (this->mCenterCoeff1).z;
    local_a8 = (float)(b->mAABB).mExtents[2] * (this->mExtentsCoeff1).z;
    uVar21 = *(uint *)(b->mAABB).mExtents;
    uVar1 = (this->mExtentsCoeff1).x;
    uVar6 = (this->mExtentsCoeff1).y;
    fVar33 = (float)uVar1 * (float)(uVar21 & 0xffff);
    local_188._4_4_ = (float)uVar6 * (float)(uVar21 >> 0x10);
    local_b0 = CONCAT44(local_188._4_4_,fVar33);
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar34 = this->mLeafVerts[0].x;
    fVar27 = this->mLeafVerts[1].x;
    fVar38 = fVar34 - fVar25;
    fVar44 = this->mLeafVerts[2].x;
    fVar35 = fVar27 - fVar25;
    fVar37 = fVar44 - fVar25;
    if (fVar35 <= fVar38) {
      fVar36 = fVar38;
      fVar22 = fVar35;
      if (fVar37 <= fVar35) {
        fVar22 = fVar37;
      }
    }
    else {
      fVar36 = fVar35;
      fVar22 = fVar38;
      if (fVar37 <= fVar38) {
        fVar22 = fVar37;
      }
    }
    if (fVar33 < fVar22) {
      return;
    }
    fVar22 = fVar37;
    if (fVar37 <= fVar36) {
      fVar22 = fVar36;
    }
    if (fVar22 < -fVar33) {
      return;
    }
    fVar36 = this->mLeafVerts[0].y;
    fVar22 = this->mLeafVerts[1].y;
    local_88 = ZEXT416((uint)fVar22);
    fVar42 = fVar36 - fStack_16c;
    fVar24 = this->mLeafVerts[2].y;
    local_168 = ZEXT416((uint)fVar24);
    fVar39 = fVar22 - fStack_16c;
    fStack_174 = fVar24 - fStack_16c;
    fStack_170 = 0.0 - fStack_16c;
    fStack_16c = 0.0 - fStack_16c;
    if (fVar39 <= fVar42) {
      fVar40 = fVar42;
      fVar31 = fVar39;
      if (fStack_174 <= fVar39) {
        fVar31 = fStack_174;
      }
    }
    else {
      fVar40 = fVar39;
      fVar31 = fVar42;
      if (fStack_174 <= fVar42) {
        fVar31 = fStack_174;
      }
    }
    if ((float)local_188._4_4_ < fVar31) {
      return;
    }
    fVar31 = fStack_174;
    if (fStack_174 <= fVar40) {
      fVar31 = fVar40;
    }
    if (fVar31 < -(float)local_188._4_4_) {
      return;
    }
    local_188._0_4_ = local_188._4_4_;
    fStack_180 = (float)local_188._4_4_;
    fStack_17c = (float)local_188._4_4_;
    fVar40 = this->mLeafVerts[0].z;
    local_128 = ZEXT416((uint)fVar40);
    fVar31 = this->mLeafVerts[1].z;
    local_f8 = ZEXT416((uint)fVar31);
    fVar23 = fVar31 - fStack_dc;
    local_148 = ZEXT416((uint)fVar23);
    fVar32 = this->mLeafVerts[2].z;
    fVar30 = fVar40 - fStack_dc;
    fStack_dc = fVar32 - fStack_dc;
    if (fVar23 <= fVar30) {
      fVar41 = fVar30;
      fVar28 = fVar23;
      if (fStack_dc <= fVar23) {
        fVar28 = fStack_dc;
      }
    }
    else {
      fVar41 = fVar23;
      fVar28 = fVar30;
      if (fStack_dc <= fVar30) {
        fVar28 = fStack_dc;
      }
    }
    if (local_a8 < fVar28) {
      return;
    }
    fVar28 = fStack_dc;
    if (fStack_dc <= fVar41) {
      fVar28 = fVar41;
    }
    if (fVar28 < -local_a8) {
      return;
    }
    local_d8 = ZEXT416((uint)fVar32);
    local_c8 = ZEXT416((uint)fVar36);
    v0 = this->mLeafVerts;
    v1 = this->mLeafVerts + 1;
    v2 = this->mLeafVerts + 2;
    local_178 = fVar39 - fVar42;
    local_e8 = fStack_dc - fVar23;
    local_114[3] = fVar35 - fVar38;
    fStack_104 = fVar37 - fVar35;
    fStack_100 = (0.0 - fVar25) - fVar35;
    fStack_fc = (0.0 - fVar25) - fVar35;
    local_58 = fVar23 - fVar30;
    local_98 = fStack_174 - fVar39;
    fStack_50 = fStack_170 - fStack_dc;
    fStack_4c = fStack_16c - fStack_174;
    local_68 = -local_58;
    fStack_64 = -local_98;
    fStack_60 = -fStack_50;
    fStack_5c = -fStack_4c;
    local_198 = local_178 * local_e8 - local_98 * local_58;
    local_78 = -local_114[3];
    fStack_74 = -local_178;
    fStack_70 = -fStack_100;
    fStack_6c = -fStack_fc;
    local_138 = fStack_104 * local_58 - local_e8 * local_114[3];
    fVar41 = local_114[3] * local_98 - fStack_104 * local_178;
    local_a4 = local_198;
    local_a0 = CONCAT44(fVar41,local_138);
    fVar28 = -local_198 * fVar38 - fVar42 * local_138;
    local_158 = (undefined1  [8])(CONCAT44(fStack_174,fVar28) ^ 0x8000000000000000);
    fStack_150 = -fStack_170;
    fStack_14c = -fStack_16c;
    lVar12 = 0;
    do {
      fVar29 = *(float *)((long)&local_b0 + lVar12 * 4);
      fVar26 = fVar29;
      if ((&local_a4)[lVar12] <= 0.0) {
        fVar26 = -fVar29;
      }
      uVar21 = -(uint)(0.0 < (&local_a4)[lVar12]);
      (&local_1a4.x)[lVar12] = (float)(~uVar21 & (uint)fVar29 | (uint)-fVar29 & uVar21);
      local_114[lVar12] = fVar26;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    fVar28 = fVar28 - fVar41 * fVar30;
    if (0.0 < local_1a4.z * fVar41 + local_1a4.x * local_198 + local_1a4.y * local_138 + fVar28) {
      return;
    }
    if (fVar28 + local_114[2] * fVar41 + local_198 * local_114[0] + local_114[1] * local_138 < 0.0)
    {
      return;
    }
    fStack_194 = fStack_174;
    fStack_190 = fStack_170;
    fStack_18c = fStack_16c;
    if (this->mFullPrimBoxTest == true) {
      fVar41 = local_58 * fVar42 + fStack_74 * fVar30;
      fVar29 = local_58 * fStack_174 + fStack_74 * fStack_dc;
      fVar28 = fVar29;
      if (fVar41 <= fVar29) {
        fVar28 = fVar41;
      }
      fVar26 = ABS(local_58) * (float)local_188._4_4_ + local_a8 * ABS(local_178);
      if (fVar26 < fVar28) {
        return;
      }
      if (fVar41 <= fVar29) {
        fVar41 = fVar29;
      }
      if (fVar41 < -fVar26) {
        return;
      }
      local_158._4_4_ = fVar37;
      local_158._0_4_ = fVar38;
      fStack_150 = 0.0 - fVar25;
      fStack_14c = 0.0 - fVar25;
      fVar28 = local_114[3] * fVar30 + local_68 * fVar38;
      fVar41 = local_114[3] * fStack_dc + local_68 * fVar37;
      fVar25 = fVar41;
      if (fVar28 <= fVar41) {
        fVar25 = fVar28;
      }
      fVar29 = ABS(local_58) * fVar33 + local_a8 * ABS(local_114[3]);
      if (fVar29 < fVar25) {
        return;
      }
      if (fVar28 <= fVar41) {
        fVar28 = fVar41;
      }
      if (fVar28 < -fVar29) {
        return;
      }
      fVar28 = local_178 * fVar35 + local_78 * fVar39;
      fVar41 = local_178 * fVar37 + local_78 * fStack_174;
      fVar25 = fVar41;
      if (fVar28 <= fVar41) {
        fVar25 = fVar28;
      }
      fVar29 = ABS(local_178) * fVar33 + ABS(local_114[3]) * (float)local_188._4_4_;
      if (fVar29 < fVar25) {
        return;
      }
      if (fVar28 <= fVar41) {
        fVar28 = fVar41;
      }
      if (fVar28 < -fVar29) {
        return;
      }
      fVar25 = fVar42 * local_e8 - local_98 * fVar30;
      fVar41 = fStack_174 * local_e8 - local_98 * fStack_dc;
      fVar28 = fVar41;
      if (fVar25 <= fVar41) {
        fVar28 = fVar25;
      }
      fVar29 = ABS(local_e8) * (float)local_188._4_4_ + local_a8 * ABS(local_98);
      if (fVar29 < fVar28) {
        return;
      }
      if (fVar25 <= fVar41) {
        fVar25 = fVar41;
      }
      if (fVar25 < -fVar29) {
        return;
      }
      fVar25 = fVar30 * fStack_104 - fVar38 * local_e8;
      fVar41 = fStack_dc * fStack_104 - fVar37 * local_e8;
      fVar28 = fVar41;
      if (fVar25 <= fVar41) {
        fVar28 = fVar25;
      }
      fVar29 = ABS(local_e8) * fVar33 + local_a8 * ABS(fStack_104);
      if (fVar29 < fVar28) {
        return;
      }
      if (fVar25 <= fVar41) {
        fVar25 = fVar41;
      }
      if (fVar25 < -fVar29) {
        return;
      }
      fVar28 = local_98 * fVar38 - fVar42 * fStack_104;
      fVar41 = local_98 * fVar35 - fStack_104 * fVar39;
      fVar25 = fVar41;
      if (fVar28 <= fVar41) {
        fVar25 = fVar28;
      }
      fVar29 = ABS(local_98) * fVar33 + ABS(fStack_104) * (float)local_188._4_4_;
      if (fVar29 < fVar25) {
        return;
      }
      if (fVar28 <= fVar41) {
        fVar28 = fVar41;
      }
      if (fVar28 < -fVar29) {
        return;
      }
      fVar28 = fVar36 - fVar24;
      fVar41 = fVar40 - fVar32;
      local_198 = ABS(fVar41);
      fStack_194 = 0.0;
      fStack_190 = 0.0;
      fStack_18c = 0.0;
      fVar25 = fVar42 * fVar41 - fVar30 * fVar28;
      fVar26 = fVar41 * fVar39 - fVar23 * fVar28;
      fVar29 = local_198 * (float)local_188._4_4_ + local_a8 * ABS(fVar28);
      fVar42 = fVar26;
      if (fVar25 <= fVar26) {
        fVar42 = fVar25;
      }
      if (fVar29 < fVar42) {
        return;
      }
      if (fVar25 <= fVar26) {
        fVar25 = fVar26;
      }
      if (fVar25 < -fVar29) {
        return;
      }
      fVar29 = fVar34 - fVar44;
      fVar38 = fVar29 * fVar30 - fVar38 * fVar41;
      fVar42 = fVar23 * fVar29 - fVar41 * fVar35;
      fVar25 = fVar42;
      if (fVar38 <= fVar42) {
        fVar25 = fVar38;
      }
      fVar23 = local_198 * fVar33 + local_a8 * ABS(fVar29);
      if (fVar23 < fVar25) {
        return;
      }
      if (fVar38 <= fVar42) {
        fVar38 = fVar42;
      }
      if (fVar38 < -fVar23) {
        return;
      }
      fVar25 = fVar28 * fVar35 - fVar39 * fVar29;
      fVar37 = fVar28 * fVar37 - fStack_174 * fVar29;
      fVar35 = fVar37;
      if (fVar25 <= fVar37) {
        fVar35 = fVar25;
      }
      fVar33 = ABS(fVar28) * fVar33 + (float)local_188._4_4_ * ABS(fVar29);
      if (fVar33 < fVar35) {
        return;
      }
      if (fVar25 <= fVar37) {
        fVar25 = fVar37;
      }
      local_114[3] = fStack_104;
      fStack_100 = fStack_104;
      fStack_fc = fStack_104;
      fStack_dc = local_e8;
      if (fVar25 < -fVar33) {
        return;
      }
    }
    b_00 = (AABBQuantizedNoLeafNode *)b->mPosData;
    fStack_e4 = fStack_dc;
    fStack_e0 = fStack_dc;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    fStack_54 = local_98;
    local_48 = local_58;
    fStack_44 = local_98;
    fStack_40 = fStack_50;
    fStack_3c = fStack_4c;
    if (((ulong)b_00 & 1) == 0) {
      _CollideTriBox(this,b_00);
    }
    else {
      pMVar9 = this->mIMesh1;
      uVar16 = (udword)((ulong)b_00 >> 1);
      uVar13 = (ulong)(pMVar9->mTriStride * uVar16);
      pIVar10 = pMVar9->mTris;
      pPVar14 = pMVar9->mVerts;
      uVar8 = pMVar9->mVertexStride;
      uVar17 = (ulong)(*(int *)((long)pIVar10->mVRef + uVar13) * uVar8);
      uVar19 = (ulong)(*(int *)((long)pIVar10->mVRef + uVar13 + 4) * uVar8);
      uVar13 = (ulong)(uVar8 * *(int *)((long)pIVar10->mVRef + uVar13 + 8));
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      local_1a4.x = (fVar22 - fVar36) * (fVar32 - fVar40) - (fVar24 - fVar36) * (fVar31 - fVar40);
      fVar25 = *(float *)((long)&pPVar14->z + uVar17);
      fVar33 = *(float *)((long)&pPVar14->z + uVar19);
      fVar35 = *(float *)((long)&pPVar14->x + uVar13);
      fVar28 = (fVar31 - fVar40) * (fVar44 - fVar34) - (fVar32 - fVar40) * (fVar27 - fVar34);
      fVar41 = (fVar27 - fVar34) * (fVar24 - fVar36) - (fVar44 - fVar34) * (fVar22 - fVar36);
      local_1a4.z = fVar41;
      local_1a4.y = fVar28;
      local_158._0_4_ = -fVar41;
      local_158._4_4_ = -local_1a4.x;
      fStack_150 = -fVar41;
      fStack_14c = -fVar41;
      fStack_16c = (float)local_158._0_4_ * fVar40 +
                   ((float)local_158._4_4_ * fVar34 - fVar36 * fVar28);
      uVar4 = *(undefined8 *)((long)&pPVar14->x + uVar17);
      uVar5 = *(undefined8 *)((long)&pPVar14->x + uVar19);
      uVar3 = *(undefined8 *)((long)&pPVar14->y + uVar13);
      fVar30 = (float)((ulong)uVar3 >> 0x20);
      fVar23 = (float)uVar3;
      local_148 = ZEXT416((uint)fVar35);
      fVar37 = fVar30 * fVar41 + local_1a4.x * fVar35 + fVar28 * fVar23 + fStack_16c;
      fVar29 = (float)uVar5;
      fVar26 = (float)((ulong)uVar5 >> 0x20);
      fVar38 = (float)uVar4;
      fVar39 = (float)((ulong)uVar4 >> 0x20);
      fStack_194 = 0.0;
      fStack_190 = 0.0;
      fStack_18c = 0.0;
      fVar42 = fStack_16c + fVar25 * fVar41 + fVar38 * local_1a4.x + fVar39 * fVar28;
      fStack_174 = fStack_16c + fVar33 * fVar41 + fVar29 * local_1a4.x + fVar26 * fVar28;
      fStack_170 = fStack_16c + fVar41 * 0.0 + fVar39 * local_1a4.x + fVar28 * 0.0;
      fStack_16c = fStack_16c + fVar41 * 0.0 + fVar26 * local_1a4.x + fVar28 * 0.0;
      fVar42 = (float)(-(uint)(1e-06 <= ABS(fVar42)) & (uint)fVar42);
      fStack_174 = (float)(-(uint)(1e-06 <= ABS(fStack_174)) & (uint)fStack_174);
      fStack_170 = (float)(-(uint)(0.0 <= ABS(fStack_170)) & (uint)fStack_170);
      fStack_16c = (float)(-(uint)(0.0 <= ABS(fStack_16c)) & (uint)fStack_16c);
      fVar37 = (float)(~-(uint)(ABS(fVar37) < 1e-06) & (uint)fVar37);
      local_178 = fVar42 * fStack_174;
      local_188._0_4_ = fVar42 * fVar37;
      local_188._4_4_ = fStack_174;
      fStack_180 = fStack_170;
      fStack_17c = fStack_16c;
      fStack_134 = fStack_174;
      fStack_130 = fStack_174;
      fStack_12c = fStack_174;
      if ((local_178 <= 0.0) || ((float)local_188._0_4_ <= 0.0)) {
        fVar29 = fVar29 - fVar38;
        fVar33 = fVar33 - fVar25;
        fVar23 = fVar23 - fVar39;
        fVar30 = fVar30 - fVar25;
        fVar43 = fVar33 * (fVar35 - fVar38) - fVar30 * fVar29;
        fVar35 = fVar29 * fVar23 - (fVar35 - fVar38) * (fVar26 - fVar39);
        fVar33 = (fVar26 - fVar39) * fVar30 - fVar23 * fVar33;
        fVar25 = fVar25 * -fVar35 + -fVar33 * fVar38 + -fVar43 * fVar39;
        fVar44 = fVar32 * fVar35 + fVar44 * fVar33 + fVar43 * fVar24 + fVar25;
        fVar27 = fVar31 * fVar35 + fVar27 * fVar33 + fVar43 * fVar22 + fVar25;
        fVar25 = fVar40 * fVar35 + fVar34 * fVar33 + fVar43 * fVar36 + fVar25;
        fVar27 = (float)(-(uint)(1e-06 <= ABS(fVar27)) & (uint)fVar27);
        fVar25 = (float)(-(uint)(1e-06 <= ABS(fVar25)) & (uint)fVar25);
        fVar44 = (float)(~-(uint)(ABS(fVar44) < 1e-06) & (uint)fVar44);
        if ((fVar25 * fVar27 <= 0.0) || (fVar25 * fVar44 <= 0.0)) {
          pPVar18 = (Point *)((long)&pPVar14->x + uVar17);
          pPVar20 = (Point *)((long)&pPVar14->x + uVar19);
          pPVar14 = (Point *)((long)&pPVar14->x + uVar13);
          fVar38 = ABS(fVar35 * fVar28 + fVar43 * (float)local_158._0_4_);
          fVar35 = ABS(fVar33 * fVar41 + fVar35 * (float)local_158._4_4_);
          fVar34 = fVar35;
          if (fVar35 <= fVar38) {
            fVar34 = fVar38;
          }
          uVar21 = 2;
          if (ABS(local_1a4.x * fVar43 + fVar33 * -fVar28) <= fVar34) {
            uVar21 = (uint)(fVar38 < fVar35);
          }
          uVar13 = (ulong)(uVar21 << 2);
          fVar34 = *(float *)((long)&v0->x + uVar13);
          fVar33 = *(float *)((long)&v1->x + uVar13);
          fVar35 = *(float *)((long)&v2->x + uVar13);
          fVar38 = *(float *)((long)&pPVar18->x + uVar13);
          fVar36 = *(float *)((long)&pPVar20->x + uVar13);
          fVar22 = *(float *)((long)&pPVar14->x + uVar13);
          local_198 = local_1a4.x;
          local_138 = fStack_174;
          if (fVar25 * fVar27 <= 0.0) {
            if (0.0 < fVar25 * fVar44) {
              fVar24 = (fVar34 - fVar33) * fVar27;
              fVar39 = (fVar35 - fVar33) * fVar27;
              fVar40 = fVar27 - fVar44;
              fVar44 = fVar27 - fVar25;
              fVar34 = fVar33;
              goto LAB_001baaa2;
            }
            if (((fVar25 != 0.0) || (NAN(fVar25))) || (0.0 < fVar27 * fVar44)) {
              fVar24 = (fVar33 - fVar34) * fVar25;
              fVar39 = (fVar35 - fVar34) * fVar25;
              fVar40 = fVar25 - fVar44;
              fVar44 = fVar25 - fVar27;
              goto LAB_001baaa2;
            }
            if ((fVar27 != 0.0) || (NAN(fVar27))) {
              fVar24 = (fVar34 - fVar33) * fVar27;
              fVar39 = (fVar35 - fVar33) * fVar27;
              fVar40 = fVar27 - fVar44;
              fVar44 = fVar27 - fVar25;
              fVar34 = fVar33;
              goto LAB_001baaa2;
            }
            if ((fVar44 != 0.0) || (NAN(fVar44))) {
              fVar24 = (fVar34 - fVar35) * fVar44;
              fVar39 = (fVar33 - fVar35) * fVar44;
              fVar40 = fVar44 - fVar27;
              fVar44 = fVar44 - fVar25;
              fVar34 = fVar35;
              goto LAB_001baaa2;
            }
LAB_001bb356:
            BVar11 = CoplanarTriTri(&local_1a4,v0,v1,v2,pPVar18,pPVar20,pPVar14);
            if (BVar11 != 0) {
LAB_001babce:
              this_00 = &this->mPairs;
              uVar21 = (this->mPairs).mCurNbEntries;
              uVar8 = this->mLeafIndex;
              if (uVar21 == (this->mPairs).mMaxNbEntries) {
                local_168._0_8_ = this_00;
                IceCore::Container::Resize(this_00,1);
                uVar21 = (this->mPairs).mCurNbEntries;
                this_00 = (Container *)local_168._0_8_;
              }
              puVar15 = (this->mPairs).mEntries;
              (this->mPairs).mCurNbEntries = uVar21 + 1;
              puVar15[uVar21] = uVar8;
              uVar21 = (this->mPairs).mCurNbEntries;
              if (uVar21 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(this_00,1);
                puVar15 = (this->mPairs).mEntries;
                uVar21 = (this->mPairs).mCurNbEntries;
              }
              (this->mPairs).mCurNbEntries = uVar21 + 1;
              puVar15[uVar21] = uVar16;
              puVar15 = &(this->super_Collider).mFlags;
              *(byte *)puVar15 = (byte)*puVar15 | 4;
            }
          }
          else {
            fVar24 = (fVar34 - fVar35) * fVar44;
            fVar39 = (fVar33 - fVar35) * fVar44;
            fVar40 = fVar44 - fVar27;
            fVar44 = fVar44 - fVar25;
            fVar34 = fVar35;
LAB_001baaa2:
            if (local_178 <= 0.0) {
              if ((float)local_188._0_4_ <= 0.0) {
                if (((fVar42 != 0.0) || (NAN(fVar42))) || (0.0 < fStack_174 * fVar37)) {
                  fVar27 = (fVar22 - fVar38) * fVar42;
                  fVar25 = (fVar36 - fVar38) * fVar42;
                  fVar33 = fVar42 - fStack_174;
                  fVar37 = fVar42 - fVar37;
                  goto LAB_001bab56;
                }
                if ((fStack_174 == 0.0) && (!NAN(fStack_174))) {
                  if ((fVar37 == 0.0) && (!NAN(fVar37))) goto LAB_001bb356;
                  goto LAB_001baaab;
                }
              }
              fVar27 = (fVar22 - fVar36) * fStack_174;
              fVar25 = (fVar38 - fVar36) * fStack_174;
              fVar33 = fStack_174 - fVar42;
              fVar37 = fStack_174 - fVar37;
              fVar38 = fVar36;
            }
            else {
LAB_001baaab:
              fVar27 = (fVar36 - fVar22) * fVar37;
              fVar25 = (fVar38 - fVar22) * fVar37;
              fVar33 = fVar37 - fVar42;
              fVar37 = fVar37 - fStack_174;
              fVar38 = fVar22;
            }
LAB_001bab56:
            fVar36 = fVar44 * fVar40;
            fVar22 = fVar37 * fVar33;
            fVar34 = fVar34 * fVar36 * fVar22;
            fVar35 = fVar34 + fVar22 * fVar24 * fVar40;
            fVar34 = fVar34 + fVar22 * fVar39 * fVar44;
            fVar38 = fVar36 * fVar22 * fVar38;
            fVar44 = fVar36 * fVar27 * fVar33 + fVar38;
            fVar38 = fVar36 * fVar25 * fVar37 + fVar38;
            fVar27 = fVar35;
            if (fVar35 <= fVar34) {
              fVar27 = fVar34;
            }
            fVar25 = fVar44;
            if (fVar38 <= fVar44) {
              fVar25 = fVar38;
            }
            if (fVar25 <= fVar27) {
              if (fVar35 <= fVar34) {
                fVar34 = fVar35;
              }
              if (fVar38 <= fVar44) {
                fVar38 = fVar44;
              }
              if (fVar34 <= fVar38) goto LAB_001babce;
            }
          }
        }
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBQuantizedNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar9 = this->mIMesh1;
  uVar16 = (udword)((ulong)b >> 1);
  uVar13 = (ulong)(pMVar9->mTriStride * uVar16);
  pIVar10 = pMVar9->mTris;
  uVar8 = pMVar9->mVertexStride;
  uVar17 = (ulong)(*(int *)((long)pIVar10->mVRef + uVar13) * uVar8);
  uVar19 = (ulong)(*(int *)((long)pIVar10->mVRef + uVar13 + 4) * uVar8);
  uVar13 = (ulong)(uVar8 * *(int *)((long)pIVar10->mVRef + uVar13 + 8));
  pPVar14 = pMVar9->mVerts;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar34 = this->mLeafVerts[1].x;
  _local_188 = ZEXT416((uint)fVar34);
  fVar27 = this->mLeafVerts[0].x;
  local_f8 = ZEXT416((uint)fVar27);
  fVar44 = this->mLeafVerts[1].y;
  local_148 = ZEXT416((uint)fVar44);
  fVar25 = this->mLeafVerts[1].z;
  local_198 = this->mLeafVerts[2].x;
  fStack_194 = this->mLeafVerts[2].y;
  fStack_190 = this->mLeafVerts[2].z;
  fStack_18c = (float)this->mLeafIndex;
  fVar33 = this->mLeafVerts[2].y;
  fVar35 = this->mLeafVerts[2].z;
  fVar37 = *(float *)((long)&pPVar14->z + uVar17);
  local_168 = ZEXT416((uint)fVar37);
  uVar2 = this->mLeafVerts[0].y;
  uVar7 = this->mLeafVerts[0].z;
  _local_158 = ZEXT416((uint)fVar33);
  local_128 = ZEXT416((uint)fVar25);
  fVar36 = fVar35 - (float)uVar7;
  local_1a4.x = (fVar44 - (float)uVar2) * fVar36 - (fVar25 - (float)uVar7) * (fVar33 - (float)uVar2)
  ;
  fVar38 = *(float *)((long)&pPVar14->z + uVar19);
  fVar39 = (fVar25 - (float)uVar7) * (local_198 - fVar27) - fVar36 * (fVar34 - fVar27);
  fVar42 = (fVar33 - (float)uVar2) * (fVar34 - fVar27) -
           (local_198 - fVar27) * (fVar44 - (float)uVar2);
  fVar36 = *(float *)((long)&pPVar14->x + uVar13);
  local_1a4.z = fVar42;
  local_1a4.y = fVar39;
  fStack_12c = (float)uVar7 * -fVar42 + (-local_1a4.x * fVar27 - (float)uVar2 * fVar39);
  uVar4 = *(undefined8 *)((long)&pPVar14->y + uVar13);
  fVar23 = (float)uVar4;
  fVar40 = (float)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)((long)&pPVar14->x + uVar17);
  uVar5 = *(undefined8 *)((long)&pPVar14->x + uVar19);
  fVar30 = (float)uVar5;
  fVar28 = (float)((ulong)uVar5 >> 0x20);
  fVar31 = (float)uVar4;
  fVar32 = (float)((ulong)uVar4 >> 0x20);
  fVar24 = fVar40 * fVar42 + local_1a4.x * fVar36 + fVar39 * fVar23 + fStack_12c;
  fVar22 = fStack_12c + fVar37 * fVar42 + fVar31 * local_1a4.x + fVar32 * fVar39;
  local_178 = fStack_12c + fVar38 * fVar42 + fVar30 * local_1a4.x + fVar28 * fVar39;
  fStack_130 = fStack_12c + fVar42 * 0.0 + fVar32 * local_1a4.x + fVar39 * 0.0;
  fStack_12c = fStack_12c + fVar42 * 0.0 + fVar28 * local_1a4.x + fVar39 * 0.0;
  fVar22 = (float)(-(uint)(1e-06 <= ABS(fVar22)) & (uint)fVar22);
  local_178 = (float)(-(uint)(1e-06 <= ABS(local_178)) & (uint)local_178);
  fStack_130 = (float)(-(uint)(0.0 <= ABS(fStack_130)) & (uint)fStack_130);
  fStack_12c = (float)(-(uint)(0.0 <= ABS(fStack_12c)) & (uint)fStack_12c);
  fVar24 = (float)(~-(uint)(ABS(fVar24) < 1e-06) & (uint)fVar24);
  local_138 = fVar22 * local_178;
  if ((0.0 < local_138) && (0.0 < fVar22 * fVar24)) {
    return;
  }
  fVar30 = fVar30 - fVar31;
  fVar38 = fVar38 - fVar37;
  fVar36 = fVar36 - fVar31;
  fVar23 = fVar23 - fVar32;
  fVar40 = fVar40 - fVar37;
  fVar41 = fVar38 * fVar36 - fVar40 * fVar30;
  fVar36 = fVar30 * fVar23 - fVar36 * (fVar28 - fVar32);
  fVar38 = (fVar28 - fVar32) * fVar40 - fVar23 * fVar38;
  fVar37 = fVar37 * -fVar36 + -fVar38 * fVar31 + -fVar41 * fVar32;
  fVar33 = fVar35 * fVar36 + local_198 * fVar38 + fVar41 * fVar33 + fVar37;
  fVar34 = fVar25 * fVar36 + fVar34 * fVar38 + fVar41 * fVar44 + fVar37;
  fVar37 = (float)uVar7 * fVar36 + fVar27 * fVar38 + fVar41 * (float)uVar2 + fVar37;
  fVar34 = (float)(-(uint)(1e-06 <= ABS(fVar34)) & (uint)fVar34);
  fVar37 = (float)(-(uint)(1e-06 <= ABS(fVar37)) & (uint)fVar37);
  fVar33 = (float)(~-(uint)(ABS(fVar33) < 1e-06) & (uint)fVar33);
  if ((0.0 < fVar37 * fVar34) && (0.0 < fVar37 * fVar33)) {
    return;
  }
  pPVar18 = (Point *)((long)&pPVar14->x + uVar17);
  pPVar20 = (Point *)((long)&pPVar14->x + uVar19);
  pPVar14 = (Point *)((long)&pPVar14->x + uVar13);
  fVar44 = ABS(fVar36 * fVar39 + fVar41 * -fVar42);
  fVar25 = ABS(fVar38 * fVar42 + fVar36 * -local_1a4.x);
  fVar27 = fVar25;
  if (fVar25 <= fVar44) {
    fVar27 = fVar44;
  }
  uVar21 = 2;
  if (ABS(local_1a4.x * fVar41 + fVar38 * -fVar39) <= fVar27) {
    uVar21 = (uint)(fVar44 < fVar25);
  }
  uVar13 = (ulong)(uVar21 << 2);
  fVar27 = *(float *)((long)&v0->x + uVar13);
  fVar44 = *(float *)((long)&v1->x + uVar13);
  fVar25 = *(float *)((long)&v2->x + uVar13);
  fVar35 = *(float *)((long)&pPVar18->x + uVar13);
  fVar38 = *(float *)((long)&pPVar20->x + uVar13);
  fVar36 = *(float *)((long)&pPVar14->x + uVar13);
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_134 = local_178;
  if (fVar37 * fVar34 <= 0.0) {
    if (0.0 < fVar37 * fVar33) {
LAB_001bb132:
      fVar42 = (fVar27 - fVar44) * fVar34;
      fVar40 = (fVar25 - fVar44) * fVar34;
      fVar39 = fVar34 - fVar33;
      fVar33 = fVar34 - fVar37;
      fVar27 = fVar44;
      goto LAB_001bb186;
    }
    if (((fVar37 != 0.0) || (NAN(fVar37))) || (0.0 < fVar34 * fVar33)) {
      fVar42 = (fVar44 - fVar27) * fVar37;
      fVar40 = (fVar25 - fVar27) * fVar37;
      fVar39 = fVar37 - fVar33;
      fVar33 = fVar37 - fVar34;
      goto LAB_001bb186;
    }
    if ((fVar34 != 0.0) || (NAN(fVar34))) goto LAB_001bb132;
    if ((fVar33 != 0.0) || (NAN(fVar33))) goto LAB_001bb0e1;
LAB_001bb39b:
    BVar11 = CoplanarTriTri(&local_1a4,v0,v1,v2,pPVar18,pPVar20,pPVar14);
    if (BVar11 == 0) {
      return;
    }
    goto LAB_001bb2b4;
  }
LAB_001bb0e1:
  fVar42 = (fVar27 - fVar25) * fVar33;
  fVar40 = (fVar44 - fVar25) * fVar33;
  fVar39 = fVar33 - fVar34;
  fVar33 = fVar33 - fVar37;
  fVar27 = fVar25;
LAB_001bb186:
  if (local_138 <= 0.0) {
    if (fVar22 * fVar24 <= 0.0) {
      if (((fVar22 != 0.0) || (NAN(fVar22))) || (0.0 < local_178 * fVar24)) {
        fVar44 = (fVar36 - fVar35) * fVar22;
        fVar25 = (fVar38 - fVar35) * fVar22;
        fVar34 = fVar22 - local_178;
        fVar24 = fVar22 - fVar24;
        goto LAB_001bb238;
      }
      if ((local_178 == 0.0) && (!NAN(local_178))) {
        if ((fVar24 == 0.0) && (!NAN(fVar24))) goto LAB_001bb39b;
        goto LAB_001bb196;
      }
    }
    fVar44 = (fVar36 - fVar38) * local_178;
    fVar25 = (fVar35 - fVar38) * local_178;
    fVar34 = local_178 - fVar22;
    fVar24 = local_178 - fVar24;
    fVar35 = fVar38;
  }
  else {
LAB_001bb196:
    fVar44 = (fVar38 - fVar36) * fVar24;
    fVar25 = (fVar35 - fVar36) * fVar24;
    fVar34 = fVar24 - fVar22;
    fVar24 = fVar24 - local_178;
    fVar35 = fVar36;
  }
LAB_001bb238:
  fVar37 = fVar33 * fVar39;
  fVar38 = fVar24 * fVar34;
  fVar27 = fVar27 * fVar37 * fVar38;
  fVar36 = fVar27 + fVar38 * fVar42 * fVar39;
  fVar27 = fVar27 + fVar38 * fVar40 * fVar33;
  fVar35 = fVar37 * fVar38 * fVar35;
  fVar44 = fVar37 * fVar44 * fVar34 + fVar35;
  fVar35 = fVar37 * fVar25 * fVar24 + fVar35;
  fVar34 = fVar36;
  if (fVar36 <= fVar27) {
    fVar34 = fVar27;
  }
  fVar25 = fVar44;
  if (fVar35 <= fVar44) {
    fVar25 = fVar35;
  }
  if (fVar34 < fVar25) {
    return;
  }
  if (fVar36 <= fVar27) {
    fVar27 = fVar36;
  }
  if (fVar35 <= fVar44) {
    fVar35 = fVar44;
  }
  if (fVar35 < fVar27) {
    return;
  }
LAB_001bb2b4:
  uVar21 = (this->mPairs).mCurNbEntries;
  uVar8 = this->mLeafIndex;
  if (uVar21 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(&this->mPairs,1);
    uVar21 = (this->mPairs).mCurNbEntries;
  }
  puVar15 = (this->mPairs).mEntries;
  (this->mPairs).mCurNbEntries = uVar21 + 1;
  puVar15[uVar21] = uVar8;
  uVar21 = (this->mPairs).mCurNbEntries;
  if (uVar21 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(&this->mPairs,1);
    puVar15 = (this->mPairs).mEntries;
    uVar21 = (this->mPairs).mCurNbEntries;
  }
  (this->mPairs).mCurNbEntries = uVar21 + 1;
  puVar15[uVar21] = uVar16;
  puVar15 = &(this->super_Collider).mFlags;
  *(byte *)puVar15 = (byte)*puVar15 | 4;
  return;
}

Assistant:

void AABBTreeCollider::_CollideTriBox(const AABBQuantizedNoLeafNode* b)
{
	// Dequantize box
	const QuantizedAABB* bb = &b->mAABB;
	const Point Pb(float(bb->mCenter[0]) * mCenterCoeff1.x, float(bb->mCenter[1]) * mCenterCoeff1.y, float(bb->mCenter[2]) * mCenterCoeff1.z);
	const Point eb(float(bb->mExtents[0]) * mExtentsCoeff1.x, float(bb->mExtents[1]) * mExtentsCoeff1.y, float(bb->mExtents[2]) * mExtentsCoeff1.z);

	// Perform triangle-box overlap test
	if(!TriBoxOverlap(Pb, eb))	return;

	if(b->HasPosLeaf())	PrimTestTriIndex(b->GetPosPrimitive());
	else				_CollideTriBox(b->GetPos());

	if(ContactFound()) return;

	if(b->HasNegLeaf())	PrimTestTriIndex(b->GetNegPrimitive());
	else				_CollideTriBox(b->GetNeg());
}